

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_setup_pre_planes
               (MACROBLOCKD *xd,int idx,YV12_BUFFER_CONFIG *src,int mi_row,int mi_col,
               scale_factors *sf,int num_planes)

{
  long lVar1;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int in_stack_00000008;
  int is_uv;
  macroblockd_plane *pd;
  int i;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff94;
  BLOCK_SIZE in_stack_ffffffffffffff9f;
  buf_2d *in_stack_ffffffffffffffa0;
  undefined4 local_54;
  undefined4 in_stack_ffffffffffffffc0;
  int mi_row_00;
  
  if (in_RDX != 0) {
    mi_row_00 = 0;
    while( true ) {
      if (in_stack_00000008 < 3) {
        local_54 = in_stack_00000008;
      }
      else {
        local_54 = 3;
      }
      if (local_54 <= mi_row_00) break;
      lVar1 = in_RDI + 0x10 + (long)mi_row_00 * 0xa30;
      setup_pred_plane(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffff94,*(undefined4 *)(lVar1 + 4)),
                       (int)((ulong)in_R9 >> 0x20),(int)in_R9,in_stack_ffffffffffffff84,mi_row_00,
                       (int)lVar1,(scale_factors *)CONCAT44(mi_row_00,in_stack_ffffffffffffffc0),
                       (int)in_R9,in_R8D);
      mi_row_00 = mi_row_00 + 1;
    }
  }
  return;
}

Assistant:

void av1_setup_pre_planes(MACROBLOCKD *xd, int idx,
                          const YV12_BUFFER_CONFIG *src, int mi_row, int mi_col,
                          const struct scale_factors *sf,
                          const int num_planes) {
  if (src != NULL) {
    // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
    // the static analysis warnings.
    for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
      struct macroblockd_plane *const pd = &xd->plane[i];
      const int is_uv = i > 0;
      setup_pred_plane(&pd->pre[idx], xd->mi[0]->bsize, src->buffers[i],
                       src->crop_widths[is_uv], src->crop_heights[is_uv],
                       src->strides[is_uv], mi_row, mi_col, sf,
                       pd->subsampling_x, pd->subsampling_y);
    }
  }
}